

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall helics::CommonCore::connectFilterTiming(CommonCore *this)

{
  uint uVar1;
  pointer pBVar2;
  long *in_RDI;
  ActionMessage add_1;
  ActionMessage add_2;
  ActionMessage add;
  GlobalFederateId fid;
  ActionMessage *in_stack_fffffffffffffd10;
  ActionMessage *M;
  undefined8 in_stack_fffffffffffffd20;
  action_t startingAction;
  undefined4 in_stack_fffffffffffffd28;
  route_id in_stack_fffffffffffffd2c;
  ActionMessage *in_stack_fffffffffffffd30;
  GlobalFederateId fedID;
  GlobalFederateId local_29c;
  ActionMessage local_298;
  uint local_1dc;
  uint local_1d8;
  BaseType local_1d4;
  GlobalFederateId local_1d0;
  BaseType local_1cc;
  GlobalFederateId local_1c8;
  BaseType local_1c4;
  GlobalFederateId local_1c0;
  BaseType local_1bc;
  BaseType local_1b8;
  GlobalFederateId local_1b4;
  BaseType local_1b0;
  GlobalFederateId local_1ac;
  ActionMessage local_1a8;
  BaseType local_ec;
  GlobalFederateId local_e8;
  undefined4 local_e4;
  undefined4 local_e0;
  undefined4 local_dc;
  GlobalFederateId local_d8 [4];
  ActionMessage local_c8;
  uint local_c;
  
  startingAction = (action_t)((ulong)in_stack_fffffffffffffd20 >> 0x20);
  if ((*(byte *)((long)in_RDI + 0x3e6) & 1) == 0) {
    *(undefined1 *)((long)in_RDI + 0x3e6) = 1;
    local_c = (uint)std::atomic<helics::GlobalFederateId>::load
                              ((atomic<helics::GlobalFederateId> *)(in_RDI + 0x15f),seq_cst);
    if ((*(byte *)((long)in_RDI + 0xdd) & 1) == 0) {
      pBVar2 = CLI::std::
               unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                             *)0x48a045);
      local_ec = (BaseType)in_RDI[3];
      GlobalFederateId::GlobalFederateId(&local_e8,(GlobalBrokerId)local_ec);
      uVar1 = (*pBVar2->_vptr_BaseTimeCoordinator[5])(pBVar2,(ulong)(uint)local_e8.gid);
      if ((uVar1 & 1) != 0) {
        local_1b0 = *(BaseType *)((long)in_RDI + 0x14);
        GlobalFederateId::GlobalFederateId(&local_1ac,(GlobalBrokerId)local_1b0);
        local_1b8 = (BaseType)in_RDI[3];
        GlobalFederateId::GlobalFederateId(&local_1b4,(GlobalBrokerId)local_1b8);
        in_stack_fffffffffffffd30 = &local_1a8;
        ActionMessage::ActionMessage
                  ((ActionMessage *)
                   CONCAT44(in_stack_fffffffffffffd2c.rid,in_stack_fffffffffffffd28),startingAction,
                   (GlobalFederateId)(BaseType)((ulong)in_stack_fffffffffffffd30 >> 0x20),
                   (GlobalFederateId)(BaseType)in_stack_fffffffffffffd30);
        setActionFlag<helics::ActionMessage,helics::TimingFlags>
                  (in_stack_fffffffffffffd30,child_flag);
        local_1c4 = (BaseType)in_RDI[3];
        GlobalFederateId::GlobalFederateId(&local_1c0,(GlobalBrokerId)local_1c4);
        in_stack_fffffffffffffd2c =
             getRoute((CommonCore *)
                      CONCAT44(in_stack_fffffffffffffd2c.rid,in_stack_fffffffffffffd28),
                      (GlobalFederateId)(BaseType)in_stack_fffffffffffffd30);
        local_1bc = in_stack_fffffffffffffd2c.rid;
        (**(code **)(*in_RDI + 0x358))(in_RDI,in_stack_fffffffffffffd2c.rid,&local_1a8);
        pBVar2 = CLI::std::
                 unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                 ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                               *)0x48a17f);
        local_1cc = (BaseType)in_RDI[3];
        GlobalFederateId::GlobalFederateId(&local_1c8,(GlobalBrokerId)local_1cc);
        (*pBVar2->_vptr_BaseTimeCoordinator[4])(pBVar2,(ulong)(uint)local_1c8.gid);
        CLI::std::
        unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>::
        operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                    *)0x48a1d2);
        local_1d4 = (BaseType)in_RDI[3];
        GlobalFederateId::GlobalFederateId(&local_1d0,(GlobalBrokerId)local_1d4);
        BaseTimeCoordinator::setAsParent
                  ((BaseTimeCoordinator *)
                   CONCAT44(in_stack_fffffffffffffd2c.rid,in_stack_fffffffffffffd28),
                   (GlobalFederateId)(BaseType)((ulong)in_stack_fffffffffffffd30 >> 0x20));
        ActionMessage::~ActionMessage(in_stack_fffffffffffffd10);
      }
      pBVar2 = CLI::std::
               unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                             *)0x48a25a);
      local_1d8 = local_c;
      (*pBVar2->_vptr_BaseTimeCoordinator[4])(pBVar2,(ulong)local_c);
      CLI::std::
      unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>::
      operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                  *)0x48a284);
      local_1dc = local_c;
      BaseTimeCoordinator::setAsChild
                ((BaseTimeCoordinator *)
                 CONCAT44(in_stack_fffffffffffffd2c.rid,in_stack_fffffffffffffd28),
                 (GlobalFederateId)(BaseType)((ulong)in_stack_fffffffffffffd30 >> 0x20));
      M = &local_298;
      ActionMessage::ActionMessage(in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c.rid);
      fedID.gid = (BaseType)((ulong)in_stack_fffffffffffffd30 >> 0x20);
      setActionFlag<helics::ActionMessage,helics::TimingFlags>(M,parent_flag);
      local_298.dest_id.gid = local_c;
      GlobalFederateId::GlobalFederateId
                (&local_29c,(GlobalBrokerId)*(BaseType *)((long)in_RDI + 0x14));
      local_298.source_id.gid = local_29c.gid;
      FilterFederate::handleMessage
                ((FilterFederate *)add.payload.bufferSize,
                 (ActionMessage *)add.payload.buffer._M_elems._56_8_);
      ActionMessage::setAction(&local_298,cmd_add_dependency);
      pBVar2 = CLI::std::
               unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
               ::operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                             *)0x48a32d);
      (*pBVar2->_vptr_BaseTimeCoordinator[5])(pBVar2,(ulong)local_c);
      CLI::std::
      unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>::
      operator->((unique_ptr<helics::BaseTimeCoordinator,_std::default_delete<helics::BaseTimeCoordinator>_>
                  *)0x48a35b);
      BaseTimeCoordinator::setAsChild
                ((BaseTimeCoordinator *)
                 CONCAT44(in_stack_fffffffffffffd2c.rid,in_stack_fffffffffffffd28),fedID);
      FilterFederate::handleMessage
                ((FilterFederate *)add.payload.bufferSize,
                 (ActionMessage *)add.payload.buffer._M_elems._56_8_);
      ActionMessage::~ActionMessage(M);
    }
    else if ((*(byte *)((long)in_RDI + 0xde) & 1) == 0) {
      ActionMessage::ActionMessage(in_stack_fffffffffffffd30,in_stack_fffffffffffffd2c.rid);
      setActionFlag<helics::ActionMessage,helics::TimingFlags>(&local_c8,parent_flag);
      local_c8.dest_id.gid = local_c;
      local_dc = 1;
      GlobalFederateId::GlobalFederateId(local_d8,(GlobalBrokerId)0x1);
      local_c8.source_id.gid = local_d8[0].gid;
      FilterFederate::handleMessage
                ((FilterFederate *)add.payload.bufferSize,
                 (ActionMessage *)add.payload.buffer._M_elems._56_8_);
      ActionMessage::setAction(&local_c8,cmd_add_dependency);
      FilterFederate::handleMessage
                ((FilterFederate *)add.payload.bufferSize,
                 (ActionMessage *)add.payload.buffer._M_elems._56_8_);
      clearActionFlag<helics::ActionMessage,helics::TimingFlags>(&local_c8,parent_flag);
      setActionFlag<helics::ActionMessage,helics::TimingFlags>(&local_c8,child_flag);
      ActionMessage::swapSourceDest(in_stack_fffffffffffffd10);
      local_e0 = 0;
      (**(code **)(*in_RDI + 0x358))(in_RDI,0,&local_c8);
      ActionMessage::setAction(&local_c8,cmd_add_dependent);
      local_e4 = 0;
      (**(code **)(*in_RDI + 0x358))(in_RDI,0,&local_c8);
      ActionMessage::~ActionMessage(in_stack_fffffffffffffd10);
    }
    *(undefined1 *)((long)in_RDI + 0x3e6) = 1;
  }
  return;
}

Assistant:

void CommonCore::connectFilterTiming()
{
    if (filterTiming) {
        return;
    }
    filterTiming = true;

    auto fid = filterFedID.load();
    if (globalTime) {
        if (!asyncTime) {
            ActionMessage add(CMD_ADD_DEPENDENT);
            setActionFlag(add, parent_flag);
            add.dest_id = fid;
            add.source_id = gRootBrokerID;
            filterFed->handleMessage(add);

            add.setAction(CMD_ADD_DEPENDENCY);
            filterFed->handleMessage(add);
            clearActionFlag(add, parent_flag);
            setActionFlag(add, child_flag);
            add.swapSourceDest();
            transmit(parent_route_id, add);
            add.setAction(CMD_ADD_DEPENDENT);
            transmit(parent_route_id, add);
        }
    } else {
        if (timeCoord->addDependent(higher_broker_id)) {
            ActionMessage add(CMD_ADD_INTERDEPENDENCY, global_broker_id_local, higher_broker_id);
            setActionFlag(add, child_flag);
            transmit(getRoute(higher_broker_id), add);
            timeCoord->addDependency(higher_broker_id);
            timeCoord->setAsParent(higher_broker_id);
        }
        // now add the filterFederate as a timeDependency
        timeCoord->addDependency(fid);
        timeCoord->setAsChild(fid);
        ActionMessage add(CMD_ADD_DEPENDENT);
        setActionFlag(add, parent_flag);
        add.dest_id = fid;
        add.source_id = global_broker_id_local;
        filterFed->handleMessage(add);
        // TODO(PT) this should be conditional as it probably isn't needed in all cases
        add.setAction(CMD_ADD_DEPENDENCY);
        timeCoord->addDependent(fid);
        timeCoord->setAsChild(fid);
        filterFed->handleMessage(add);
    }

    //
    filterTiming = true;
}